

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::InitializeEncodingAndFormat
          (LogMessageData *this)

{
  Span<char> *value;
  int iVar1;
  pointer pcVar2;
  char *tag;
  uint uVar3;
  uint64_t uVar4;
  uint uVar5;
  Span<char> *buf;
  uint *buf_00;
  Span<char> *in_R8;
  Span<const_char> value_00;
  
  pcVar2 = (pointer)(this->entry).full_filename_._M_len;
  tag = (this->entry).full_filename_._M_str;
  value = &this->encoded_remaining_actual_do_not_use_directly;
  if ((this->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (this->encoded_remaining_actual_do_not_use_directly).ptr_ = (this->encoded_buf)._M_elems;
    (this->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    InitializeEncodingAndFormat(this);
  }
  value_00.len_ = (size_type)value;
  value_00.ptr_ = pcVar2;
  buf = value;
  EncodeBytesTruncate((log_internal *)0x2,(uint64_t)tag,value_00,in_R8);
  iVar1 = (this->entry).line_;
  if ((this->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (this->encoded_remaining_actual_do_not_use_directly).ptr_ = (this->encoded_buf)._M_elems;
    (this->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    InitializeEncodingAndFormat(this);
  }
  EncodeVarint((log_internal *)0x3,(long)iVar1,(uint64_t)value,buf);
  uVar4 = ToUnixNanos((Time)(this->entry).timestamp_.rep_);
  if ((this->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (this->encoded_remaining_actual_do_not_use_directly).ptr_ = (this->encoded_buf)._M_elems;
    (this->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    InitializeEncodingAndFormat(this);
  }
  EncodeVarint((log_internal *)0x4,uVar4,(uint64_t)value,buf);
  buf_00 = &switchD_00241b4b::switchdataD_002ceca8;
  switch((this->entry).severity_) {
  case kInfo:
    iVar1 = (this->entry).verbose_level_;
    uVar5 = 600 - iVar1;
    buf_00 = (uint *)(ulong)uVar5;
    uVar3 = 800;
    if (iVar1 != -1) {
      uVar3 = uVar5;
    }
    uVar4 = (uint64_t)(int)uVar3;
    break;
  case kWarning:
    uVar4 = 900;
    break;
  case kError:
    uVar4 = 0x3b6;
    break;
  case kFatal:
    uVar4 = 0x44c;
    break;
  default:
    uVar4 = 800;
    buf_00 = (uint *)buf;
  }
  if (value->ptr_ == (pointer)0x0) {
    (this->encoded_remaining_actual_do_not_use_directly).ptr_ = (this->encoded_buf)._M_elems;
    (this->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    InitializeEncodingAndFormat(this);
  }
  EncodeVarint((log_internal *)0x5,uVar4,(uint64_t)value,(Span<char> *)buf_00);
  iVar1 = (this->entry).tid_;
  if ((this->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (this->encoded_remaining_actual_do_not_use_directly).ptr_ = (this->encoded_buf)._M_elems;
    (this->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    InitializeEncodingAndFormat(this);
  }
  EncodeVarint((log_internal *)0x6,(long)iVar1,(uint64_t)value,(Span<char> *)buf_00);
  return;
}

Assistant:

void LogMessage::LogMessageData::InitializeEncodingAndFormat() {
  EncodeStringTruncate(EventTag::kFileName, entry.source_filename(),
                       &encoded_remaining());
  EncodeVarint(EventTag::kFileLine, entry.source_line(), &encoded_remaining());
  EncodeVarint(EventTag::kTimeNsecs, absl::ToUnixNanos(entry.timestamp()),
               &encoded_remaining());
  EncodeVarint(EventTag::kSeverity,
               ProtoSeverity(entry.log_severity(), entry.verbosity()),
               &encoded_remaining());
  EncodeVarint(EventTag::kThreadId, entry.tid(), &encoded_remaining());
}